

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadAnimationKeyFrames
          (OgreBinarySerializer *this,Animation *anim,VertexAnimationTrack *track)

{
  StreamReader<false,_false> *pSVar1;
  int8_t *__src;
  iterator this_00;
  uchar uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  uint uVar5;
  VertexData *pVVar6;
  uint8_t *__dest;
  MemoryStreamReader *pMVar7;
  long lVar8;
  ulong __n;
  bool bVar9;
  float fVar10;
  PoseRef pr;
  MorphKeyFrame kf;
  PoseRef local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [2];
  undefined1 local_70 [8];
  PoseRef local_68;
  iterator iStack_60;
  PoseRef *local_58;
  VertexAnimationTrack *local_50;
  PoseKeyFrameList *local_48;
  MorphKeyFrameList *local_40;
  Animation *local_38;
  
  pSVar1 = this->m_reader;
  if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
    local_50 = track;
    local_38 = anim;
    uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
    uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar5;
    pMVar7 = this->m_reader;
    bVar9 = *(int *)&pMVar7->end != *(int *)&pMVar7->current;
    if ((ushort)(uVar3 + 0x2eef) < 2 && bVar9) {
      local_48 = &local_50->poseKeyFrames;
      local_40 = &local_50->morphKeyFrames;
      do {
        if (uVar3 == 0xd112) {
          local_68.index = 0;
          local_68._2_2_ = 0;
          local_68.influence = 0.0;
          iStack_60._M_current = (PoseRef *)0x0;
          local_58 = (PoseRef *)0x0;
          local_70._0_4_ = StreamReader<false,_false>::Get<float>(pMVar7);
          pSVar1 = this->m_reader;
          if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
            uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
            uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
            this->m_currentLen = uVar5;
            pMVar7 = this->m_reader;
            bVar9 = *(int *)&pMVar7->end == *(int *)&pMVar7->current;
            if (uVar3 == 0xd113 && !bVar9) {
              do {
                uVar4 = StreamReader<false,_false>::Get<unsigned_short>(pMVar7);
                local_88.index = uVar4;
                fVar10 = StreamReader<false,_false>::Get<float>(this->m_reader);
                local_88.influence = fVar10;
                if (iStack_60._M_current == local_58) {
                  std::vector<Assimp::Ogre::PoseRef,std::allocator<Assimp::Ogre::PoseRef>>::
                  _M_realloc_insert<Assimp::Ogre::PoseRef_const&>
                            ((vector<Assimp::Ogre::PoseRef,std::allocator<Assimp::Ogre::PoseRef>> *)
                             (local_70 + 8),iStack_60,&local_88);
                }
                else {
                  *iStack_60._M_current = local_88;
                  iStack_60._M_current = iStack_60._M_current + 1;
                }
                pSVar1 = this->m_reader;
                if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
                  uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
                  uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
                  this->m_currentLen = uVar5;
                }
                pMVar7 = this->m_reader;
                bVar9 = *(int *)&pMVar7->end == *(int *)&pMVar7->current;
              } while ((!bVar9) && (uVar3 == 0xd113));
            }
            if (!bVar9) {
              StreamReader<false,_false>::IncPtr(pMVar7,-6);
            }
          }
          std::vector<Assimp::Ogre::PoseKeyFrame,_std::allocator<Assimp::Ogre::PoseKeyFrame>_>::
          push_back(local_48,(value_type *)local_70);
          if (local_68 != (PoseRef)0x0) {
            operator_delete((void *)local_68,(long)local_58 - (long)local_68);
          }
        }
        else if (uVar3 == 0xd111) {
          local_68 = (PoseRef)0x0;
          iStack_60._M_current = (PoseRef *)0x0;
          local_70._0_4_ = StreamReader<false,_false>::Get<float>(pMVar7);
          uVar2 = StreamReader<false,_false>::Get<unsigned_char>(this->m_reader);
          pVVar6 = Animation::AssociatedVertexData(local_38,local_50);
          lVar8 = 0x18;
          if (uVar2 == '\0') {
            lVar8 = 0xc;
          }
          __n = lVar8 * (ulong)(pVVar6->super_IVertexData).count;
          __dest = (uint8_t *)operator_new__(__n);
          __src = this->m_reader->current;
          StreamReader<false,_false>::SetPtr(this->m_reader,__src + __n);
          memcpy(__dest,__src,__n);
          local_88 = (PoseRef)Intern::AllocateFromAssimpHeap::operator_new(0x28);
          *(undefined ***)local_88 = &PTR__MemoryIOStream_007fd1f0;
          *(uint8_t **)((long)local_88 + 8) = __dest;
          *(ulong *)((long)local_88 + 0x10) = __n;
          *(size_t *)((long)local_88 + 0x18) = 0;
          *(bool *)((long)local_88 + 0x20) = true;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::MemoryIOStream*>
                    (a_Stack_80,(MemoryIOStream *)local_88);
          this_00._M_current = iStack_60._M_current;
          iStack_60._M_current = (PoseRef *)a_Stack_80[0]._M_pi;
          local_68 = local_88;
          local_88.index = 0;
          local_88._2_2_ = 0;
          local_88.influence = 0.0;
          a_Stack_80[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_current !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_current);
          }
          if (a_Stack_80[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_80[0]._M_pi);
          }
          std::vector<Assimp::Ogre::MorphKeyFrame,_std::allocator<Assimp::Ogre::MorphKeyFrame>_>::
          push_back(local_40,(value_type *)local_70);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iStack_60._M_current !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iStack_60._M_current);
          }
        }
        pSVar1 = this->m_reader;
        if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
          uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
          uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar5;
        }
        pMVar7 = this->m_reader;
        bVar9 = *(int *)&pMVar7->end != *(int *)&pMVar7->current;
      } while ((bVar9) && ((ushort)(uVar3 + 0x2eef) < 2));
    }
    if (bVar9) {
      StreamReader<false,_false>::IncPtr(pMVar7,-6);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadAnimationKeyFrames(Animation *anim, VertexAnimationTrack *track)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() &&
            (id == M_ANIMATION_MORPH_KEYFRAME ||
             id == M_ANIMATION_POSE_KEYFRAME))
        {
            if (id == M_ANIMATION_MORPH_KEYFRAME)
            {
                MorphKeyFrame kf;
                kf.timePos = Read<float>();
                bool hasNormals = Read<bool>();

                size_t vertexCount = anim->AssociatedVertexData(track)->count;
                size_t vertexSize = sizeof(float) * (hasNormals ? 6 : 3);
                size_t numBytes = vertexCount * vertexSize;

                uint8_t *morphBuffer = ReadBytes(numBytes);
                kf.buffer = MemoryStreamPtr(new Assimp::MemoryIOStream(morphBuffer, numBytes, true));

                track->morphKeyFrames.push_back(kf);
            }
            else if (id == M_ANIMATION_POSE_KEYFRAME)
            {
                PoseKeyFrame kf;
                kf.timePos = Read<float>();

                if (!AtEnd())
                {
                    id = ReadHeader();
                    while (!AtEnd() && id == M_ANIMATION_POSE_REF)
                    {
                        PoseRef pr;
                        pr.index = Read<uint16_t>();
                        pr.influence = Read<float>();
                        kf.references.push_back(pr);

                        if (!AtEnd())
                            id = ReadHeader();
                    }
                    if (!AtEnd())
                        RollbackHeader();
                }

                track->poseKeyFrames.push_back(kf);
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}